

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseAllSettledResolveOrRejectElementFunction::
JavascriptPromiseAllSettledResolveOrRejectElementFunction
          (JavascriptPromiseAllSettledResolveOrRejectElementFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper
          *remainingElementsWrapper,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper,
          bool isRejecting)

{
  bool isRejecting_local;
  JavascriptPromiseCapability *capabilities_local;
  JavascriptArray *values_local;
  uint32 index_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *this_local;
  
  JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
            (&this->super_JavascriptPromiseAllResolveElementFunction,type,functionInfo,index,values,
             capabilities,remainingElementsWrapper);
  (this->super_JavascriptPromiseAllResolveElementFunction).super_RuntimeFunction.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject = (IRecyclerVisitedObject)&PTR_Finalize_01e3a3c8;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>::
  WriteBarrierPtr(&this->alreadyCalledWrapper,alreadyCalledWrapper);
  this->isRejecting = isRejecting;
  return;
}

Assistant:

JavascriptPromiseAllSettledResolveOrRejectElementFunction::JavascriptPromiseAllSettledResolveOrRejectElementFunction(DynamicType* type, FunctionInfo* functionInfo, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper, bool isRejecting)
        : JavascriptPromiseAllResolveElementFunction(type, functionInfo, index, values, capabilities, remainingElementsWrapper), alreadyCalledWrapper(alreadyCalledWrapper), isRejecting(isRejecting)
    { }